

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QSize __thiscall QAbstractItemView::sizeHintForIndex(QAbstractItemView *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  QSize QVar6;
  long in_FS_OFFSET;
  QStyleOptionViewItem option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QAbstractItemViewPrivate::isIndexValid(*(QAbstractItemViewPrivate **)(this + 8),index);
  if (bVar2) {
    uVar5 = 0xffffffff00000000;
    plVar3 = (long *)(**(code **)(*(long *)this + 0x208))(this,index);
    memset(&option,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem(&option);
    (**(code **)(*(long *)this + 0x2f8))(this,&option);
    if (plVar3 == (long *)0x0) {
      uVar4 = 0xffffffff;
    }
    else {
      uVar4 = (**(code **)(*plVar3 + 0x68))(plVar3,&option,index);
      uVar5 = uVar4 & 0xffffffff00000000;
      uVar4 = uVar4 & 0xffffffff;
    }
    QVar6 = (QSize)(uVar5 | uVar4);
    QStyleOptionViewItem::~QStyleOptionViewItem(&option);
  }
  else {
    QVar6.wd.m_i = -1;
    QVar6.ht.m_i = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QSize QAbstractItemView::sizeHintForIndex(const QModelIndex &index) const
{
    Q_D(const QAbstractItemView);
    if (!d->isIndexValid(index))
        return QSize();
    const auto delegate = itemDelegateForIndex(index);
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    return delegate ? delegate->sizeHint(option, index) : QSize();
}